

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wstring.hpp
# Opt level: O0

wstring * __thiscall
msgpack::v1::adaptor::
as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>::
operator()(as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
           *this,object *o)

{
  uint uVar1;
  long lVar2;
  void *__s;
  int *in_RDX;
  wstring *in_RDI;
  object *pend;
  object *p;
  wstring *v;
  undefined4 in_stack_ffffffffffffffa0;
  type in_stack_ffffffffffffffa4;
  ulong local_38;
  
  if (*in_RDX != 7) {
    __s = (void *)__cxa_allocate_exception(8);
    memset(__s,0,8);
    type_error::type_error
              ((type_error *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    __cxa_throw(__s,&type_error::typeinfo,type_error::~type_error);
  }
  std::__cxx11::wstring::wstring(in_RDI);
  std::__cxx11::wstring::reserve((ulong)in_RDI);
  if (in_RDX[2] != 0) {
    local_38 = *(ulong *)(in_RDX + 4);
    lVar2 = *(long *)(in_RDX + 4);
    uVar1 = in_RDX[2];
    do {
      in_stack_ffffffffffffffa4 =
           object::as<wchar_t>((object *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      std::__cxx11::wstring::push_back((wchar_t)in_RDI);
      local_38 = local_38 + 0x18;
    } while (local_38 < lVar2 + (ulong)uVar1 * 0x18);
  }
  return in_RDI;
}

Assistant:

std::wstring operator()(const msgpack::object& o) const {
        if (o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        std::wstring v;
        v.reserve(o.via.array.size);
        if (o.via.array.size > 0) {
            msgpack::object* p = o.via.array.ptr;
            msgpack::object* const pend = o.via.array.ptr + o.via.array.size;
            do {
                v.push_back(p->as<wchar_t>());
                ++p;
            } while (p < pend);
        }
        return v;
    }